

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUITabControl.cpp
# Opt level: O0

s32 __thiscall irr::gui::CGUITabControl::calculateScrollIndexFromActive(CGUITabControl *this)

{
  bool bVar1;
  s32 sVar2;
  long *pos_rightmost;
  array<irr::gui::IGUITab_*> *this_00;
  IGUITab **ppIVar3;
  int iVar4;
  IGUIFont *in_RDI;
  rect<int> rVar5;
  s32 pos_rr;
  s32 len;
  s32 i;
  s32 pos_cl;
  s32 pos_right;
  s32 pos_left;
  IGUIFont *font;
  IGUISkin *skin;
  u32 in_stack_ffffffffffffff9c;
  array<irr::gui::IGUITab_*> *in_stack_ffffffffffffffa0;
  array<irr::gui::IGUITab_*> *in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar6;
  s32 in_stack_ffffffffffffffbc;
  int local_40;
  int local_3c;
  int local_38;
  IGUIFont *pIVar7;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (((in_RDI[10].field_0x1e & 1) == 0) ||
     (pIVar7 = in_RDI,
     bVar1 = core::array<irr::gui::IGUITab_*>::empty((array<irr::gui::IGUITab_*> *)0x3d056d), bVar1)
     ) {
    iVar4 = 0;
  }
  else {
    pos_rightmost = (long *)(**(code **)(**(long **)&in_RDI[9].field_0x8 + 0x60))();
    if (pos_rightmost == (long *)0x0) {
      iVar4 = 0;
    }
    else {
      this_00 = (array<irr::gui::IGUITab_*> *)(**(code **)(*pos_rightmost + 0x30))(pos_rightmost,0);
      if (this_00 == (array<irr::gui::IGUITab_*> *)0x0) {
        iVar4 = 0;
      }
      else {
        iVar4 = *(int *)&in_RDI[2]._vptr_IGUIFont + 2;
        rVar5 = IGUIElement::getAbsolutePosition(*(IGUIElement **)&in_RDI[0xb].field_0x8);
        local_38 = rVar5.UpperLeftCorner.X;
        local_3c = (iVar4 + local_38 + -2) / 2;
        for (local_40 = *(int *)&in_RDI[10].field_0x18; 0 < local_40; local_40 = local_40 + -1) {
          ppIVar3 = core::array<irr::gui::IGUITab_*>::operator[]
                              (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
          if (*ppIVar3 != (IGUITab *)0x0) {
            in_stack_ffffffffffffffa8 = this_00;
            ppIVar3 = core::array<irr::gui::IGUITab_*>::operator[]
                                (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
            (*((*ppIVar3)->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x15])();
            in_stack_ffffffffffffffbc =
                 calcTabWidth((CGUITabControl *)
                              CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),in_RDI,
                              (wchar_t *)in_stack_ffffffffffffffa8);
            if (local_40 == *(int *)&in_RDI[10].field_0x18) {
              in_stack_ffffffffffffffbc = in_stack_ffffffffffffffbc / 2;
            }
            if (local_3c - in_stack_ffffffffffffffbc < iVar4) break;
            local_3c = local_3c - in_stack_ffffffffffffffbc;
          }
        }
        iVar4 = local_40;
        if (local_40 != 0) {
          iVar6 = 0;
          bVar1 = needScrollControl((CGUITabControl *)
                                    CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                    (s32)((ulong)pIVar7 >> 0x20),SUB81((ulong)pIVar7 >> 0x18,0),
                                    (s32 *)pos_rightmost);
          if (!bVar1) {
            do {
              do {
                iVar4 = local_40;
                local_40 = iVar4 + -1;
                if (local_40 < 1) {
                  return iVar4;
                }
                ppIVar3 = core::array<irr::gui::IGUITab_*>::operator[]
                                    (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff9c);
              } while (*ppIVar3 == (IGUITab *)0x0);
              in_stack_ffffffffffffffa0 = this_00;
              ppIVar3 = core::array<irr::gui::IGUITab_*>::operator[]
                                  (this_00,in_stack_ffffffffffffff9c);
              (*((*ppIVar3)->super_IGUIElement).super_IEventReceiver._vptr_IEventReceiver[0x15])();
              sVar2 = calcTabWidth((CGUITabControl *)CONCAT44(in_stack_ffffffffffffffbc,iVar6),
                                   in_RDI,(wchar_t *)in_stack_ffffffffffffffa8);
              iVar6 = sVar2 + iVar6;
            } while (iVar6 <= local_38 + -2);
          }
        }
      }
    }
  }
  return iVar4;
}

Assistant:

s32 CGUITabControl::calculateScrollIndexFromActive()
{
	if (!ScrollControl || Tabs.empty())
		return 0;

	IGUISkin *skin = Environment->getSkin();
	if (!skin)
		return false;

	IGUIFont *font = skin->getFont();
	if (!font)
		return false;

	const s32 pos_left = AbsoluteRect.UpperLeftCorner.X + 2;
	const s32 pos_right = UpButton->getAbsolutePosition().UpperLeftCorner.X - 2;

	// Move from center to the left border left until it is reached
	s32 pos_cl = (pos_left + pos_right) / 2;
	s32 i = ActiveTabIndex;
	for (; i > 0; --i) {
		if (!Tabs[i])
			continue;

		s32 len = calcTabWidth(font, Tabs[i]->getText());
		if (i == ActiveTabIndex)
			len /= 2;
		if (pos_cl - len < pos_left)
			break;

		pos_cl -= len;
	}
	if (i == 0)
		return i;

	// Is scrolling to right still possible?
	s32 pos_rr = 0;
	if (needScrollControl(i, true, &pos_rr))
		return i; // Yes? -> OK

	// No? -> Decrease "i" more. Append tabs until scrolling becomes necessary
	for (--i; i > 0; --i) {
		if (!Tabs[i])
			continue;

		pos_rr += calcTabWidth(font, Tabs[i]->getText());
		if (pos_rr > pos_right)
			break;
	}
	return i + 1;
}